

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O2

void apply_imputation_results<std::vector<ImputedData<int,double>,std::allocator<ImputedData<int,double>>>,InputData<double,int>>
               (vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>
                *impute_vec,Imputer *imputer,InputData<double,_int> *input_data,int nthreads)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  int *piVar4;
  pointer pdVar5;
  unsigned_long uVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  pointer pIVar11;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var12;
  ulong uVar13;
  long lVar14;
  size_t ix_1;
  ulong uVar15;
  size_t ix;
  long lVar16;
  size_t sVar17;
  ulong uVar18;
  double dVar19;
  vector<unsigned_long,_std::allocator<unsigned_long>_> row_pos;
  allocator_type local_71;
  vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_> *local_70;
  int *local_68;
  Imputer *local_60;
  InputData<double,_int> *local_58;
  value_type_conflict1 local_50;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_70 = impute_vec;
  local_60 = imputer;
  local_58 = input_data;
  if (input_data->Xc_indptr != (int *)0x0) {
    local_50 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,input_data->nrows,
               &local_50,&local_71);
    local_68 = input_data->Xc_indptr;
    uVar13 = 0;
    while (uVar18 = uVar13, uVar18 < input_data->ncols_numeric) {
      iVar10 = local_68[uVar18 + 1];
      pdVar3 = input_data->Xc;
      piVar4 = input_data->Xc_ind;
      pIVar11 = (local_70->
                super__Vector_base<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pdVar5 = (local_60->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar16 = (long)local_68[uVar18]; uVar13 = uVar18 + 1, input_data = local_58,
          lVar16 < iVar10; lVar16 = lVar16 + 1) {
        if (0x7fefffffffffffff < (ulong)ABS(pdVar3[lVar16])) {
          iVar2 = piVar4[lVar16];
          uVar6 = local_48._M_impl.super__Vector_impl_data._M_start[iVar2];
          dVar1 = *(double *)
                   (*(long *)&pIVar11[iVar2].sp_num_weight.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data + uVar6 * 8);
          if ((dVar1 <= 0.0) ||
             (dVar19 = *(double *)
                        (*(long *)&pIVar11[iVar2].sp_num_sum.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data + uVar6 * 8),
             0x7fefffffffffffff < (ulong)ABS(dVar19))) {
            dVar19 = pdVar5[uVar18];
          }
          else {
            dVar19 = dVar19 / dVar1;
          }
          pdVar3[lVar16] = dVar19;
          local_48._M_impl.super__Vector_impl_data._M_start[iVar2] = uVar6 + 1;
        }
      }
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
  }
  uVar13 = input_data->nrows;
  uVar18 = 0;
  while (uVar18 < uVar13) {
    local_68 = (int *)uVar18;
    if ((input_data->has_missing).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar18] != '\0') {
      pIVar11 = (local_70->
                super__Vector_base<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      sVar7 = pIVar11[uVar18].n_missing_num;
      pIVar11 = pIVar11 + uVar18;
      pdVar3 = input_data->numeric_data;
      pdVar5 = (local_60->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (sVar17 = 0; sVar7 != sVar17; sVar17 = sVar17 + 1) {
        lVar16 = *(long *)(*(long *)&(pIVar11->missing_num).
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data + sVar17 * 8);
        dVar1 = *(double *)
                 (*(long *)&(pIVar11->num_weight).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data + sVar17 * 8);
        if ((dVar1 <= 0.0) ||
           (dVar19 = *(double *)
                      (*(long *)&(pIVar11->num_sum).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl +
                      sVar17 * 8), 0x7fefffffffffffff < (ulong)ABS(dVar19))) {
          dVar19 = pdVar5[lVar16];
        }
        else {
          dVar19 = dVar19 / dVar1;
        }
        pdVar3[uVar18 + lVar16 * uVar13] = dVar19;
      }
      for (uVar15 = 0;
          pIVar11 = (local_70->
                    super__Vector_base<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>
                    )._M_impl.super__Vector_impl_data._M_start,
          uVar15 < pIVar11[uVar18].n_missing_cat; uVar15 = uVar15 + 1) {
        lVar16 = *(long *)&pIVar11[uVar18].cat_sum.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data;
        lVar8 = *(long *)(*(long *)&pIVar11[uVar18].missing_cat.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data + uVar15 * 8);
        lVar14 = lVar8 * 0x18;
        lVar9 = *(long *)(lVar16 + lVar14);
        _Var12 = std::
                 __max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                           (lVar9,*(undefined8 *)(lVar16 + 8 + lVar14));
        uVar13 = local_58->nrows;
        piVar4 = local_58->categ_data;
        iVar10 = (int)((ulong)((long)_Var12._M_current - lVar9) >> 3);
        piVar4[uVar18 + uVar13 * lVar8] = iVar10;
        if ((iVar10 == 0) &&
           (**(double **)
              (*(long *)&(local_70->
                         super__Vector_base<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[uVar18].cat_sum.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data + lVar14) <= 0.0)) {
          piVar4[uVar18 + uVar13 * lVar8] =
               (local_60->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8];
        }
        input_data = local_58;
      }
    }
    uVar18 = (long)local_68 + 1;
  }
  return;
}

Assistant:

void apply_imputation_results(imp_arr    &impute_vec,
                              Imputer    &imputer,
                              InputData  &input_data,
                              int        nthreads)
{
    size_t col;

    if (input_data.Xc_indptr != NULL)
    {
        std::vector<size_t> row_pos(input_data.nrows, 0);
        size_t row;

        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            for (auto ix = input_data.Xc_indptr[col]; ix < input_data.Xc_indptr[col + 1]; ix++)
            {
                if (is_na_or_inf(input_data.Xc[ix]))
                {
                    row = input_data.Xc_ind[ix];
                    if (impute_vec[row].sp_num_weight[row_pos[row]] > 0 && !is_na_or_inf(impute_vec[row].sp_num_sum[row_pos[row]]))
                        input_data.Xc[ix]
                            =
                        impute_vec[row].sp_num_sum[row_pos[row]]
                            /
                        impute_vec[row].sp_num_weight[row_pos[row]];
                    else
                        input_data.Xc[ix]
                            =
                        imputer.col_means[col];

                    row_pos[row]++;
                }
            }
        }
    }

    #pragma omp parallel for schedule(dynamic) num_threads(nthreads) shared(input_data, impute_vec, imputer) private(col)
    for (size_t_for row = 0; row < (decltype(row))input_data.nrows; row++)
    {
        if (input_data.has_missing[row])
        {
            for (size_t ix = 0; ix < impute_vec[row].n_missing_num; ix++)
            {
                col = impute_vec[row].missing_num[ix];
                if (impute_vec[row].num_weight[ix] > 0 && !is_na_or_inf(impute_vec[row].num_sum[ix]))
                    input_data.numeric_data[row + col * input_data.nrows]
                        =
                    impute_vec[row].num_sum[ix] / impute_vec[row].num_weight[ix];
                else
                    input_data.numeric_data[row + col * input_data.nrows]
                        =
                    imputer.col_means[col];
            }

            for (size_t ix = 0; ix < impute_vec[row].n_missing_cat; ix++)
            {
                col = impute_vec[row].missing_cat[ix];
                input_data.categ_data[row + col * input_data.nrows]
                    =
                std::distance(impute_vec[row].cat_sum[col].begin(),
                              std::max_element(impute_vec[row].cat_sum[col].begin(),
                                                 impute_vec[row].cat_sum[col].end()));

                if (input_data.categ_data[row + col * input_data.nrows] == 0 && impute_vec[row].cat_sum[col][0] <= 0)
                    input_data.categ_data[row + col * input_data.nrows]
                        =
                    imputer.col_modes[col];
            }
        }
    }
}